

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall GrcManager::AddToFsmClasses(GrcManager *this,GdlGlyphClassDefn *pglfc,int nPassID)

{
  vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *this_00;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *pvVar1;
  iterator __position;
  bool bVar2;
  GdlGlyphClassDefn *local_18;
  
  pvVar1 = this->m_prgvpglfcFsmClasses;
  local_18 = pglfc;
  bVar2 = GdlGlyphClassDefn::IsFsmClass(pglfc,nPassID);
  if (!bVar2) {
    this_00 = (vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)(pvVar1 + nPassID);
    GdlGlyphClassDefn::MarkFsmClass
              (local_18,nPassID,(int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3));
    __position._M_current = *(GdlGlyphClassDefn ***)(this_00 + 8);
    if (__position._M_current == *(GdlGlyphClassDefn ***)(this_00 + 0x10)) {
      std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
      _M_realloc_insert<GdlGlyphClassDefn*const&>(this_00,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  return;
}

Assistant:

void GrcManager::AddToFsmClasses(GdlGlyphClassDefn * pglfc, int nPassID)
{
	std::vector<GdlGlyphClassDefn *> * pvpglfcThisPass = m_prgvpglfcFsmClasses + nPassID;
	if (pglfc->IsFsmClass(nPassID))
	{
		//	Already assigned an ID for this pass.
		Assert((*pvpglfcThisPass)[pglfc->FsmID(nPassID)] == pglfc);
		return;
	}
	pglfc->MarkFsmClass(nPassID, int(pvpglfcThisPass->size()));
	pvpglfcThisPass->push_back(pglfc);
}